

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarchingCube.cpp
# Opt level: O0

double __thiscall
MarchingCube::interp(MarchingCube *this,Field<double,_unsigned_short> *F,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  unsigned_short i;
  unsigned_short i_00;
  unsigned_short j;
  unsigned_short j_00;
  unsigned_short k;
  unsigned_short k_00;
  unsigned_short *puVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double u0;
  double u1;
  double t0;
  double t1;
  double s0;
  double s1;
  uint16_t k1;
  uint16_t k0;
  uint16_t j1;
  uint16_t j0;
  uint16_t i1;
  uint16_t i0;
  double z_local;
  double y_local;
  double x_local;
  Field<double,_unsigned_short> *F_local;
  MarchingCube *this_local;
  
  if ((((0.0 <= x) && (0.0 <= y)) && (0.0 <= z)) &&
     (((puVar8 = Field<double,_unsigned_short>::x(F), x <= (double)(int)(*puVar8 - 1) &&
       (puVar8 = Field<double,_unsigned_short>::y(F), y <= (double)(int)(*puVar8 - 1))) &&
      (puVar8 = Field<double,_unsigned_short>::z(F), z <= (double)(int)(*puVar8 - 1))))) {
    i = (unsigned_short)(int)x;
    i_00 = i + 1;
    j = (unsigned_short)(int)y;
    j_00 = j + 1;
    k = (unsigned_short)(int)z;
    k_00 = k + 1;
    dVar10 = x - (double)((int)x & 0xffff);
    dVar11 = y - (double)((int)y & 0xffff);
    dVar12 = z - (double)((int)z & 0xffff);
    dVar13 = 1.0 - dVar12;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i,j,k);
    dVar1 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i,j,k_00);
    dVar2 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i,j_00,k);
    dVar3 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i,j_00,k_00);
    dVar4 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i_00,j,k);
    dVar5 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i_00,j,k_00);
    dVar6 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i_00,j_00,k);
    dVar7 = *pdVar9;
    pdVar9 = Field<double,_unsigned_short>::operator()(F,i_00,j_00,k_00);
    return (1.0 - dVar10) *
           ((1.0 - dVar11) * (dVar13 * dVar1 + dVar12 * dVar2) +
           dVar11 * (dVar13 * dVar3 + dVar12 * dVar4)) +
           dVar10 * ((1.0 - dVar11) * (dVar13 * dVar5 + dVar12 * dVar6) +
                    dVar11 * (dVar13 * dVar7 + dVar12 * *pdVar9));
  }
  return 65536.0;
}

Assistant:

inline double MarchingCube::interp(
        const Field<double, std::uint16_t>& F,
        const double x,
        const double y,
        const double z
    ) const
{
    // Outside of the simulation cube positive to build triangle around the mesh
    if (x < 0 || y < 0 || z < 0 || x > F.x()-1 || y > F.y()-1 || z > F.z()-1)
    {
        return 65536;
    }
    const std::uint16_t i0 = static_cast<std::uint16_t>(x);
    const std::uint16_t i1 = i0 + 1;
    const std::uint16_t j0 = static_cast<std::uint16_t>(y);
    const std::uint16_t j1 = j0 + 1;
    const std::uint16_t k0 = static_cast<std::uint16_t>(z);
    const std::uint16_t k1 = k0 + 1;

    const double s1 = x - i0;
    const double s0 = 1.0 - s1;
    const double t1 = y - j0;
    const double t0 = 1.0 - t1;
    const double u1 = z - k0;
    const double u0 = 1.0 - u1;

    return s0 * (     t0 * ( u0 * F(i0, j0, k0) + u1 * F(i0, j0, k1) )
                    + t1 * ( u0 * F(i0, j1, k0) + u1 * F(i0, j1, k1) )
                    )
         + s1 * (     t0 * ( u0 * F(i1, j0, k0) + u1 * F(i1, j0, k1) )
                    + t1 * ( u0 * F(i1, j1, k0) + u1 * F(i1, j1, k1) )
                );
}